

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O2

void __thiscall
pstore::http::
buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
::buffered_reader(buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                  *this,_func_error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<unsigned_char,__1L>_ptr
                        *refill,size_t buffer_size)

{
  ulong in_RAX;
  storage_type<pstore::gsl::details::extent_type<_1L>_> sVar1;
  undefined8 uStack_18;
  
  this->refill_ = refill;
  uStack_18 = in_RAX & 0xffffffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->buf_,buffer_size + (buffer_size == 0),
             (value_type_conflict2 *)((long)&uStack_18 + 7),(allocator_type *)((long)&uStack_18 + 6)
            );
  sVar1 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
          pstore::gsl::make_span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (&this->buf_);
  (this->span_).storage_ = sVar1;
  pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&this->pos_);
  pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&this->end_);
  this->is_eof_ = false;
  (this->push_).valid_ = false;
  check_invariants(this);
  return;
}

Assistant:

buffered_reader<IO, RefillFunction>::buffered_reader (RefillFunction const refill,
                                                              std::size_t const buffer_size)
                : refill_{refill}
                , buf_ (std::max (buffer_size, std::size_t{1}), std::uint8_t{0})
                , span_{gsl::make_span (buf_)}
                , pos_{span_.begin ()}
                , end_{span_.begin ()} {
            this->check_invariants ();
        }